

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator.cc
# Opt level: O2

bool google::protobuf::util::anon_unknown_4::WithinFractionOrMargin<float>
               (float x,float y,float fraction,float margin)

{
  float fVar1;
  float fVar2;
  LogMessageFatal aLStack_18 [16];
  
  if (((0.0 <= fraction) && (fraction < 1.0)) && (0.0 <= margin)) {
    if ((uint)ABS(y) < 0x7f800000 && (uint)ABS(x) < 0x7f800000) {
      fVar1 = ABS(y);
      if (ABS(y) <= ABS(x)) {
        fVar1 = ABS(x);
      }
      fVar2 = fVar1 * fraction;
      if (fVar1 * fraction <= margin) {
        fVar2 = margin;
      }
      return ABS(x - y) <= fVar2;
    }
    return false;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/util/field_comparator.cc"
             ,0x2d,0x35,"fraction >= T(0) && fraction < T(1) && margin >= T(0)");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

bool WithinFractionOrMargin(const T x, const T y, const T fraction,
                            const T margin) {
  ABSL_DCHECK(fraction >= T(0) && fraction < T(1) && margin >= T(0));

  if (!std::isfinite(x) || !std::isfinite(y)) {
    return false;
  }
  const T relative_margin = fraction * std::max(std::fabs(x), std::fabs(y));
  return std::fabs(x - y) <= std::max(margin, relative_margin);
}